

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_debug_helpers_generated.c
# Opt level: O0

char * mbedtls_tls_prf_types_str(mbedtls_tls_prf_types in)

{
  char *pcStack_10;
  mbedtls_tls_prf_types in_local;
  
  switch(in) {
  case MBEDTLS_SSL_TLS_PRF_NONE:
    pcStack_10 = "MBEDTLS_SSL_TLS_PRF_NONE";
    break;
  case MBEDTLS_SSL_TLS_PRF_SHA384:
    pcStack_10 = "MBEDTLS_SSL_TLS_PRF_SHA384";
    break;
  case MBEDTLS_SSL_TLS_PRF_SHA256:
    pcStack_10 = "MBEDTLS_SSL_TLS_PRF_SHA256";
    break;
  case MBEDTLS_SSL_HKDF_EXPAND_SHA384:
    pcStack_10 = "MBEDTLS_SSL_HKDF_EXPAND_SHA384";
    break;
  case MBEDTLS_SSL_HKDF_EXPAND_SHA256:
    pcStack_10 = "MBEDTLS_SSL_HKDF_EXPAND_SHA256";
    break;
  default:
    pcStack_10 = "UNKNOWN_VALUE";
  }
  return pcStack_10;
}

Assistant:

const char *mbedtls_tls_prf_types_str( mbedtls_tls_prf_types in )
{
    switch (in) {
        case MBEDTLS_SSL_TLS_PRF_NONE:
            return "MBEDTLS_SSL_TLS_PRF_NONE";
        case MBEDTLS_SSL_TLS_PRF_SHA384:
            return "MBEDTLS_SSL_TLS_PRF_SHA384";
        case MBEDTLS_SSL_TLS_PRF_SHA256:
            return "MBEDTLS_SSL_TLS_PRF_SHA256";
        case MBEDTLS_SSL_HKDF_EXPAND_SHA384:
            return "MBEDTLS_SSL_HKDF_EXPAND_SHA384";
        case MBEDTLS_SSL_HKDF_EXPAND_SHA256:
            return "MBEDTLS_SSL_HKDF_EXPAND_SHA256";
        default:
            return "UNKNOWN_VALUE";
    }
}